

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

ItemSimilarityRecommender_ConnectedItem *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>(Arena *arena)

{
  ItemSimilarityRecommender_ConnectedItem *this;
  
  if (arena == (Arena *)0x0) {
    this = (ItemSimilarityRecommender_ConnectedItem *)operator_new(0x28);
    CoreML::Specification::ItemSimilarityRecommender_ConnectedItem::
    ItemSimilarityRecommender_ConnectedItem(this,(Arena *)0x0,false);
  }
  else {
    this = (ItemSimilarityRecommender_ConnectedItem *)
           AllocateAlignedWithHook
                     (arena,0x28,
                      (type_info *)
                      &CoreML::Specification::ItemSimilarityRecommender_ConnectedItem::typeinfo);
    CoreML::Specification::ItemSimilarityRecommender_ConnectedItem::
    ItemSimilarityRecommender_ConnectedItem(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }